

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::MethodDescriptorProto::InternalSerializeWithCachedSizesToArray
          (MethodDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 extraout_var;
  uint8 *puVar4;
  MethodOptions *in_RDX;
  uint8 *in_RSI;
  MethodDescriptorProto *in_RDI;
  uint32 cached_has_bits;
  Operation in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  EpsCopyOutputStream *in_stack_fffffffffffffea0;
  MethodOptions *in_stack_fffffffffffffeb0;
  uint8 *in_stack_fffffffffffffeb8;
  MethodOptions *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  MethodOptions *in_stack_fffffffffffffed0;
  MethodDescriptorProto *unknown_fields;
  
  uVar3 = (uint32)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  uVar1 = (in_RDI->_has_bits_).has_bits_[0];
  unknown_fields = in_RDI;
  if ((uVar1 & 1) != 0) {
    _internal_name_abi_cxx11_((MethodDescriptorProto *)0x51c3bc);
    std::__cxx11::string::data();
    uVar3 = extraout_var;
    _internal_name_abi_cxx11_((MethodDescriptorProto *)0x51c3d3);
    std::__cxx11::string::length();
    in_stack_fffffffffffffed0 = in_RDX;
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98
               ,(char *)0x51c3f3);
    in_RDX = in_stack_fffffffffffffed0;
    _internal_name_abi_cxx11_((MethodDescriptorProto *)0x51c407);
    in_RSI = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       ((EpsCopyOutputStream *)in_stack_fffffffffffffed0,uVar3,
                        (string *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  if ((uVar1 & 2) != 0) {
    _internal_input_type_abi_cxx11_((MethodDescriptorProto *)0x51c439);
    in_stack_fffffffffffffeb8 = (uint8 *)std::__cxx11::string::data();
    _internal_input_type_abi_cxx11_((MethodDescriptorProto *)0x51c450);
    std::__cxx11::string::length();
    in_stack_fffffffffffffec0 = in_RDX;
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98
               ,(char *)0x51c470);
    in_RDX = in_stack_fffffffffffffec0;
    _internal_input_type_abi_cxx11_((MethodDescriptorProto *)0x51c484);
    in_RSI = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       ((EpsCopyOutputStream *)in_stack_fffffffffffffed0,uVar3,
                        (string *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  if ((uVar1 & 4) != 0) {
    _internal_output_type_abi_cxx11_((MethodDescriptorProto *)0x51c4b6);
    std::__cxx11::string::data();
    _internal_output_type_abi_cxx11_((MethodDescriptorProto *)0x51c4cd);
    std::__cxx11::string::length();
    in_stack_fffffffffffffeb0 = in_RDX;
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98
               ,(char *)0x51c4ed);
    in_RDX = in_stack_fffffffffffffeb0;
    _internal_output_type_abi_cxx11_((MethodDescriptorProto *)0x51c501);
    in_RSI = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       ((EpsCopyOutputStream *)in_stack_fffffffffffffed0,uVar3,
                        (string *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  if ((uVar1 & 8) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffea0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    _Internal::options(in_RDI);
    uVar3 = internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,in_RSI);
    uVar3 = MethodOptions::GetCachedSize((MethodOptions *)0x51c5f4);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar4);
    in_RSI = MethodOptions::InternalSerializeWithCachedSizesToArray
                       (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                        (EpsCopyOutputStream *)in_stack_fffffffffffffeb0);
  }
  if ((uVar1 & 0x10) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffea0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    bVar2 = _internal_client_streaming(in_RDI);
    uVar3 = internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,in_RSI);
    in_RSI = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar2,puVar4);
  }
  if ((uVar1 & 0x20) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffea0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    bVar2 = _internal_server_streaming(in_RDI);
    uVar3 = internal::WireFormatLite::MakeTag(6,WIRETYPE_VARINT);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,in_RSI);
    in_RSI = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar2,puVar4);
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    in_RSI = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)unknown_fields,in_RSI,(EpsCopyOutputStream *)in_RDX);
  }
  return in_RSI;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* MethodDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MethodDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string input_type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_input_type().data(), static_cast<int>(this->_internal_input_type().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.input_type");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_input_type(), target);
  }

  // optional string output_type = 3;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_output_type().data(), static_cast<int>(this->_internal_output_type().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.output_type");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_output_type(), target);
  }

  // optional .google.protobuf.MethodOptions options = 4;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        4, _Internal::options(this), target, stream);
  }

  // optional bool client_streaming = 5 [default = false];
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(5, this->_internal_client_streaming(), target);
  }

  // optional bool server_streaming = 6 [default = false];
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(6, this->_internal_server_streaming(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MethodDescriptorProto)
  return target;
}